

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer *
helics::typeConvertComplex
          (SmallBuffer *__return_storage_ptr__,DataType type,double *vals,size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  double dVar4;
  undefined8 uVar5;
  size_type __n;
  string *val;
  reference pvVar6;
  long lVar7;
  size_t ii;
  size_t sVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec_1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  json json;
  NamedPoint local_f8;
  string local_c8;
  string local_a0;
  double local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  json_value jStack_70;
  data local_68;
  string *local_58;
  code *local_50;
  json_value local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if (vals == (double *)0x0 || size == 0) {
    emptyBlock(__return_storage_ptr__,type,HELICS_COMPLEX_VECTOR);
    return __return_storage_ptr__;
  }
  if (size == 1) {
    local_f8.name._M_dataplus._M_p = (pointer)*vals;
    local_f8.name._M_string_length = (size_type)vals[1];
    typeConvert(__return_storage_ptr__,type,(complex<double> *)&local_f8);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_c8,
               size);
    do {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_c8,vals
                 ,vals + 1);
      vals = vals + 2;
      size = size - 1;
    } while (size != 0);
    local_f8.name._M_dataplus._M_p = local_c8._M_dataplus._M_p;
    local_f8.name._M_string_length = local_c8._M_string_length;
    local_f8.name.field_2._M_allocated_capacity =
         (long)
         "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
         + 0x5f;
    local_f8.name.field_2._8_8_ = 1;
    local_50 = ::fmt::v11::detail::value<fmt::v11::context>::
               format_custom<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,fmt::v11::formatter<fmt::v11::join_view<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,char>,char,void>>
    ;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x4;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_58;
    local_58 = &local_f8.name;
    ::fmt::v11::vformat_abi_cxx11_(&local_a0,(v11 *)"[{}]",fmt,args);
    local_40 = (json_value)local_a0._M_string_length;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_40)
    ;
    _Var10._M_p = local_c8._M_dataplus._M_p;
    uVar5 = local_c8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
      _Var10._M_p = local_c8._M_dataplus._M_p;
      uVar5 = local_c8.field_2._M_allocated_capacity;
    }
    goto joined_r0x00291b64;
  case HELICS_DOUBLE:
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)vals + lVar7) * *(double *)((long)vals + lVar7);
      lVar7 = lVar7 + 8;
    } while (size << 3 != lVar7);
    if (dVar4 < 0.0) {
      local_f8.name._M_dataplus._M_p = (pointer)sqrt(dVar4);
    }
    else {
      local_f8.name._M_dataplus._M_p = (pointer)SQRT(dVar4);
    }
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_f8);
    break;
  case HELICS_INT:
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)vals + lVar7) * *(double *)((long)vals + lVar7);
      lVar7 = lVar7 + 8;
    } while (size << 3 != lVar7);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
LAB_00291da0:
    local_f8.name._M_dataplus._M_p = (pointer)(long)dVar4;
    goto LAB_00291da5;
  case HELICS_COMPLEX:
    local_f8.name._M_dataplus._M_p = (pointer)*vals;
    local_f8.name._M_string_length = (size_type)vals[1];
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_f8);
    break;
  case HELICS_COMPLEX_VECTOR:
    local_f8.name._M_dataplus._M_p = (pointer)0x0;
    local_f8.name._M_string_length = 0;
    local_f8.name.field_2._M_allocated_capacity = 0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_f8,
               size);
    do {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_f8,vals
                 ,vals + 1);
      vals = vals + 2;
      size = size - 1;
    } while (size != 0);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_f8);
    _Var10._M_p = local_f8.name._M_dataplus._M_p;
    uVar5 = local_f8.name.field_2._M_allocated_capacity;
joined_r0x00291b64:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar9 = (char *)(uVar5 + -(long)_Var10._M_p);
LAB_00291cb8:
      operator_delete(_Var10._M_p,(ulong)pcVar9);
    }
    break;
  case HELICS_NAMED_POINT:
    local_a0._M_string_length = (size_type)(vals + size);
    local_58 = &local_a0;
    local_a0.field_2._M_allocated_capacity =
         (long)
         "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
         + 0x5f;
    local_a0.field_2._8_8_ = 1;
    local_50 = ::fmt::v11::detail::value<fmt::v11::context>::
               format_custom<fmt::v11::join_view<double_const*,double_const*,char>,fmt::v11::formatter<fmt::v11::join_view<double_const*,double_const*,char>,char,void>>
    ;
    fmt_00.size_ = 0xf;
    fmt_00.data_ = (char *)0x4;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    local_a0._M_dataplus._M_p = (pointer)vals;
    ::fmt::v11::vformat_abi_cxx11_(&local_c8,(v11 *)"[{}]",fmt_00,args_00);
    _Var10._M_p = local_c8._M_dataplus._M_p;
    pcVar9 = local_c8._M_dataplus._M_p + (long)(_Rep_type *)local_c8._M_string_length;
    local_80 = nan("0");
    paVar1 = &local_f8.name.field_2;
    local_f8.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,_Var10._M_p,pcVar9);
    local_f8.value = local_80;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.name._M_dataplus._M_p,
                      (ulong)(local_f8.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return __return_storage_ptr__;
    }
    pcVar9 = (char *)(local_c8.field_2._M_allocated_capacity + 1);
    _Var10._M_p = local_c8._M_dataplus._M_p;
    goto LAB_00291cb8;
  case HELICS_BOOL:
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)vals + lVar7) * *(double *)((long)vals + lVar7);
      lVar7 = lVar7 + 8;
    } while (size << 3 != lVar7);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    pcVar9 = "+0";
    if (dVar4 != 0.0) {
      pcVar9 = "*1";
    }
    if (NAN(dVar4)) {
      pcVar9 = "*1";
    }
    local_f8.name._M_string_length = (size_type)(pcVar9 + 1);
    local_f8.name._M_dataplus._M_p = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_f8)
    ;
    break;
  case HELICS_TIME:
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)vals + lVar7) * *(double *)((long)vals + lVar7);
      lVar7 = lVar7 + 8;
    } while (size << 3 != lVar7);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    local_f8.name._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
    if (dVar4 <= -9223372036.854765) {
      local_f8.name._M_dataplus._M_p = (pointer)0x8000000000000001;
    }
    else if (dVar4 < 9223372036.854765) {
      dVar4 = dVar4 * 1000000000.0 +
              *(double *)(&DAT_0041eab0 + (ulong)(0.0 <= dVar4 * 1000000000.0) * 8);
      goto LAB_00291da0;
    }
LAB_00291da5:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_f8);
    break;
  default:
    if (type == HELICS_JSON) {
      local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffffffffff00;
      local_a0._M_string_length = 0;
      val = typeNameStringRef_abi_cxx11_(HELICS_VECTOR);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_a0,"type");
      vVar2 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_68.m_type;
      jVar3 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_68.m_value;
      local_68.m_type = vVar2;
      local_68.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_68);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_c8,(initializer_list_t)ZEXT816(0),false,array);
      sVar8 = 0;
      do {
        local_f8.name._M_dataplus._M_p = (pointer)0x0;
        local_f8.name._M_string_length = 0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_f8,vals[sVar8]);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_c8,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_f8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_f8);
        sVar8 = sVar8 + 1;
      } while (size != sVar8);
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8._M_dataplus._M_p;
      jStack_70 = (json_value)local_c8._M_string_length;
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
      local_c8._M_string_length = 0;
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_a0,"value");
      vVar2 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = (value_t)local_78;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_78._1_7_,vVar2);
      jVar3 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = jStack_70;
      jStack_70 = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_78);
      fileops::generateJsonString(&local_f8.name,(json *)&local_a0,true);
      __n = local_f8.name._M_string_length;
      _Var10._M_p = local_f8.name._M_dataplus._M_p;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_f8.name._M_string_length);
      __return_storage_ptr__->bufferSize = __n;
      memcpy(__return_storage_ptr__->heap,_Var10._M_p,__n);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
        operator_delete(local_f8.name._M_dataplus._M_p,
                        (ulong)(local_f8.name.field_2._M_allocated_capacity + 1));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_c8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_a0);
      return __return_storage_ptr__;
    }
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,vals,size);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvertComplex(DataType type, const double* vals, size_t size)
{
    if ((vals == nullptr) || (size == 0)) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (size == 1) {
        // treat like a single complex
        return typeConvert(type, std::complex<double>{vals[0], vals[1]});
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(vals, size));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(vals, size)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(vectorNorm(vals, size)));
        case DataType::HELICS_COMPLEX: {
            const std::complex<double> cval(vals[0], vals[1]);
            return ValueConverter<std::complex<double>>::convert(cval);
        }
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(vals, size) != 0.0) ? "1" :
                                                                                               "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(cvec));
        }
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsVectorString(vals, size), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::vector<std::complex<double>>>::convert(cvec);
        } break;
        case DataType::HELICS_VECTOR:
        default:
            return ValueConverter<double>::convert(vals, size);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (size_t ii = 0; ii < size; ++ii) {
                jsonArray.push_back(vals[ii]);
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}